

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * upb_Arena_Malloc(upb_Arena *a,size_t size)

{
  ulong size_00;
  size_t sVar1;
  void *ret;
  size_t span;
  size_t size_local;
  upb_Arena *a_local;
  
  size_00 = size + 7 & 0xfffffffffffffff8;
  sVar1 = _upb_ArenaHas_dont_copy_me__upb_internal_use_only(a);
  if (sVar1 < size_00) {
    a_local = (upb_Arena *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size_00);
  }
  else {
    a_local = (upb_Arena *)a->ptr_dont_copy_me__upb_internal_use_only;
    if ((upb_Arena *)
        ((ulong)((long)&a_local->ptr_dont_copy_me__upb_internal_use_only + 7U) & 0xfffffffffffffff8)
        != a_local) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only =
         a->ptr_dont_copy_me__upb_internal_use_only + size_00;
  }
  return a_local;
}

Assistant:

UPB_API_INLINE void* upb_Arena_Malloc(struct upb_Arena* a, size_t size) {
  void* UPB_PRIVATE(_upb_Arena_SlowMalloc)(struct upb_Arena * a, size_t size);

  size = UPB_ALIGN_MALLOC(size);
  const size_t span = size + UPB_ASAN_GUARD_SIZE;
  if (UPB_UNLIKELY(UPB_PRIVATE(_upb_ArenaHas)(a) < span)) {
    return UPB_PRIVATE(_upb_Arena_SlowMalloc)(a, span);
  }

  // We have enough space to do a fast malloc.
  void* ret = a->UPB_ONLYBITS(ptr);
  UPB_ASSERT(UPB_ALIGN_MALLOC((uintptr_t)ret) == (uintptr_t)ret);
  UPB_ASSERT(UPB_ALIGN_MALLOC(size) == size);
  UPB_UNPOISON_MEMORY_REGION(ret, size);

  a->UPB_ONLYBITS(ptr) += span;

  return ret;
}